

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

void __thiscall
rtosc::MergePorts::MergePorts(MergePorts *this,initializer_list<const_rtosc::Ports_*> c)

{
  iterator ppPVar1;
  value_type *pvVar2;
  pointer pPVar3;
  char *__s2;
  int iVar4;
  bool bVar5;
  iterator ppPVar6;
  Port *pp;
  pointer pPVar7;
  Port *p;
  value_type *__x;
  
  ppPVar6 = c._M_array;
  Ports::Ports(&this->super_Ports,(initializer_list<rtosc::Port>)ZEXT816(0));
  if (c._M_len != 0) {
    ppPVar1 = ppPVar6 + c._M_len;
    do {
      pvVar2 = ((*ppPVar6)->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (__x = ((*ppPVar6)->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
                 _M_impl.super__Vector_impl_data._M_start; __x != pvVar2; __x = __x + 1) {
        pPVar7 = (this->super_Ports).ports.
                 super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pPVar3 = (this->super_Ports).ports.
                 super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pPVar7 == pPVar3) {
LAB_00105efc:
          std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::push_back
                    ((vector<rtosc::Port,_std::allocator<rtosc::Port>_> *)this,__x);
        }
        else {
          __s2 = __x->name;
          bVar5 = false;
          do {
            iVar4 = strcmp(pPVar7->name,__s2);
            if (iVar4 == 0) {
              bVar5 = true;
            }
            pPVar7 = pPVar7 + 1;
          } while (pPVar7 != pPVar3);
          if (!bVar5) goto LAB_00105efc;
        }
      }
      ppPVar6 = ppPVar6 + 1;
    } while (ppPVar6 != ppPVar1);
  }
  Ports::refreshMagic(&this->super_Ports);
  return;
}

Assistant:

MergePorts::MergePorts(std::initializer_list<const rtosc::Ports*> c)
    :Ports({})
{
    //XXX TODO remove duplicates in some sane and documented way
    //e.g. repeated ports override and remove older ones
    for(auto *to_clone:c) {
        assert(to_clone);
        for(auto &p:to_clone->ports) {
            bool already_there = false;
            for(auto &pp:ports)
                if(!strcmp(pp.name, p.name))
                    already_there = true;

            if(!already_there)
                ports.push_back(p);
        }
    }

    refreshMagic();
}